

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_psbt.cpp
# Opt level: O1

void __thiscall cfd::Psbt::Psbt(Psbt *this,uint32_t psbt_version,TransactionContext *context)

{
  _Rb_tree_header *p_Var1;
  pointer pTVar2;
  vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> utxo_list;
  vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> local_578;
  vector<cfd::core::TxInReference,_std::allocator<cfd::core::TxInReference>_> local_560;
  OutPoint local_548;
  UtxoData local_520;
  
  core::Transaction::Transaction((Transaction *)&local_520,&context->super_Transaction);
  core::Psbt::Psbt(&this->super_Psbt,psbt_version,(Transaction *)&local_520);
  core::Transaction::~Transaction((Transaction *)&local_520);
  (this->super_Psbt)._vptr_Psbt = (_func_int **)&PTR__Psbt_00739740;
  p_Var1 = &(this->verify_ignore_map_)._M_t._M_impl.super__Rb_tree_header;
  (this->verify_ignore_map_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->verify_ignore_map_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0
  ;
  (this->verify_ignore_map_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->verify_ignore_map_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->verify_ignore_map_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_578.super__Vector_base<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_578.super__Vector_base<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_578.super__Vector_base<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  core::Transaction::GetTxInList(&local_560,&context->super_Transaction);
  if (local_560.
      super__Vector_base<cfd::core::TxInReference,_std::allocator<cfd::core::TxInReference>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      local_560.
      super__Vector_base<cfd::core::TxInReference,_std::allocator<cfd::core::TxInReference>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    pTVar2 = local_560.
             super__Vector_base<cfd::core::TxInReference,_std::allocator<cfd::core::TxInReference>_>
             ._M_impl.super__Vector_impl_data._M_start;
    do {
      core::OutPoint::OutPoint
                (&local_548,&(pTVar2->super_AbstractTxInReference).txid_,
                 (pTVar2->super_AbstractTxInReference).vout_);
      TransactionContext::GetTxInUtxoData(&local_520,context,&local_548);
      std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::emplace_back<cfd::UtxoData>
                (&local_578,&local_520);
      UtxoData::~UtxoData(&local_520);
      local_548.txid_._vptr_Txid = (_func_int **)&PTR__Txid_00735400;
      if (local_548.txid_.data_.data_.
          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_548.txid_.data_.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      pTVar2 = pTVar2 + 1;
    } while (pTVar2 != local_560.
                       super__Vector_base<cfd::core::TxInReference,_std::allocator<cfd::core::TxInReference>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
  }
  std::vector<cfd::core::TxInReference,_std::allocator<cfd::core::TxInReference>_>::~vector
            (&local_560);
  CollectInputUtxo(this,&local_578);
  std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::~vector(&local_578);
  return;
}

Assistant:

Psbt::Psbt(uint32_t psbt_version, const TransactionContext& context)
    : cfd::core::Psbt(psbt_version, static_cast<const Transaction>(context)) {
  std::vector<UtxoData> utxo_list;
  for (const auto& txin : context.GetTxInList()) {
    utxo_list.push_back(context.GetTxInUtxoData(txin.GetOutPoint()));
  }
  CollectInputUtxo(utxo_list);
}